

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O0

void __thiscall MemoryAccountant::useCacheSizes(MemoryAccountant *this,size_t *sizes,size_t length)

{
  UtestShell *pUVar1;
  long *in_RDI;
  NormalTestTerminator *this_00;
  size_t in_stack_ffffffffffffffd0;
  size_t *in_stack_ffffffffffffffd8;
  TestTerminator in_stack_ffffffffffffffe0;
  
  if (*in_RDI != 0) {
    pUVar1 = UtestShell::getCurrent();
    in_stack_ffffffffffffffe0._vptr_TestTerminator = (_func_int **)0x0;
    this_00 = (NormalTestTerminator *)&stack0xffffffffffffffe0;
    NormalTestTerminator::NormalTestTerminator(this_00);
    (*pUVar1->_vptr_UtestShell[0x1a])
              (pUVar1,"MemoryAccountant: Cannot set cache sizes as allocations already occured!",
               "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/build_O0/CMake/cpputest/cpputest-src/src/CppUTest/TestMemoryAllocator.cpp"
               ,0x1c7,this_00);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x179e2a);
  }
  createCacheSizeNodes
            ((MemoryAccountant *)in_stack_ffffffffffffffe0._vptr_TestTerminator,
             in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  *(undefined1 *)(in_RDI + 2) = 1;
  return;
}

Assistant:

void MemoryAccountant::useCacheSizes(size_t sizes[], size_t length)
{
    if (head_)
      FAIL("MemoryAccountant: Cannot set cache sizes as allocations already occured!");

    createCacheSizeNodes(sizes, length);
    useCacheSizes_ = true;
}